

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

complex<float> __thiscall
TPZSparseBlockDiagonal<std::complex<float>_>::Get
          (TPZSparseBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col)

{
  _ComplexT extraout_RAX;
  complex<float> cVar1;
  int64_t cblockindex;
  int64_t rblockindex;
  int64_t rblock;
  int64_t cblock;
  int64_t local_38;
  long local_30;
  _ComplexT local_28;
  _ComplexT local_20;
  
  FindBlockIndex(this,row,(int64_t *)&local_28,&local_30);
  cVar1._M_value = extraout_RAX;
  if (local_28 != 0xffffffffffffffff) {
    FindBlockIndex(this,col,(int64_t *)&local_20,&local_38);
    cVar1._M_value = local_20;
    if (local_20 == local_28) {
      cVar1._M_value =
           (_ComplexT)
           ((this->super_TPZBlockDiagonal<std::complex<float>_>).fStorage.fStore +
           (this->super_TPZBlockDiagonal<std::complex<float>_>).fBlockPos.fStore[local_20] +
           local_30);
    }
  }
  return (complex<float>)cVar1._M_value;
}

Assistant:

const TVar TPZSparseBlockDiagonal<TVar>::Get(const int64_t row, const int64_t col) const
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return (TVar)0;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return (TVar)0;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	return this->fStorage[this->fBlockPos[rblock]+pos];
}